

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

const_iterator __thiscall
chaiscript::Type_Conversions::find(Type_Conversions *this,Type_Info *to,Type_Info *from)

{
  anon_class_16_2_51500968_for__M_pred __pred;
  iterator __first;
  iterator __last;
  _Rb_tree_const_iterator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_> _Var1;
  Type_Info *from_local;
  Type_Info *to_local;
  Type_Conversions *this_local;
  
  __first = std::
            set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
            ::begin((set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
                     *)(this + 0x38));
  __last = std::
           set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
           ::end((set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
                  *)(this + 0x38));
  __pred.from = from;
  __pred.to = to;
  _Var1 = std::
          find_if<std::_Rb_tree_const_iterator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>,chaiscript::Type_Conversions::find(chaiscript::Type_Info_const&,chaiscript::Type_Info_const&)const::_lambda(std::shared_ptr<chaiscript::detail::Type_Conversion_Base>const&)_1_>
                    (__first._M_node,__last._M_node,__pred);
  return (const_iterator)_Var1._M_node;
}

Assistant:

std::set<std::shared_ptr<detail::Type_Conversion_Base>>::const_iterator find(const Type_Info &to, const Type_Info &from) const {
      return std::find_if(m_conversions.begin(),
                          m_conversions.end(),
                          [&to, &from](const std::shared_ptr<detail::Type_Conversion_Base> &conversion) {
                            return conversion->to().bare_equal(to) && conversion->from().bare_equal(from);
                          });
    }